

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O2

void __thiscall
BRTS<TTA>::FindRunsMem(BRTS<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  unsigned_short uVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint64_t *puVar13;
  Run *pRVar14;
  Run *pRVar15;
  unsigned_short uVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  uint64_t uVar20;
  short sVar21;
  Run *pRVar22;
  Run *pRVar23;
  
  lVar7 = (long)data_width;
  uVar19 = *bits_start;
  sVar21 = 0;
  pRVar14 = runs;
  puVar13 = bits_start;
  while( true ) {
    for (; puVar18 = puVar13 + 1, uVar19 != 0;
        uVar19 = (~uVar19 >> ((byte)lVar9 & 0x3f)) << ((byte)lVar9 & 0x3f)) {
      lVar9 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      pRVar14->start_pos = (short)lVar9 + sVar21;
      uVar19 = (~uVar19 >> ((byte)lVar9 & 0x3f)) << ((byte)lVar9 & 0x3f);
      while (uVar19 == 0) {
        sVar21 = sVar21 + 0x40;
        puVar18 = puVar13 + 1;
        puVar13 = puVar13 + 1;
        uVar19 = ~*puVar18;
      }
      lVar9 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      pRVar14->end_pos = (short)lVar9 + sVar21;
      uVar6 = TTA::MemNewLabel();
      pRVar14->label = uVar6;
      pRVar14 = pRVar14 + 1;
    }
    if (puVar18 == bits_start + lVar7) break;
    sVar21 = sVar21 + 0x40;
    uVar19 = *puVar18;
    puVar13 = puVar18;
  }
  pRVar14->start_pos = 0xffff;
  pRVar14->end_pos = 0xffff;
  lVar9 = 1;
LAB_001f3298:
  if (height <= lVar9) {
    uVar6 = TTA::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
    return;
  }
  pRVar15 = pRVar14 + 1;
  puVar13 = bits_start + lVar9 * lVar7;
  puVar11 = puVar13 + lVar7;
  uVar20 = *puVar13;
  lVar8 = 0;
  pRVar14 = pRVar15;
  do {
    while (puVar12 = puVar13 + 1, uVar20 != 0) {
      lVar3 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar19 = (~uVar20 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f);
      lVar17 = lVar8;
      while (uVar19 == 0) {
        lVar17 = lVar17 + 0x40;
        puVar18 = puVar13 + 1;
        puVar13 = puVar13 + 1;
        uVar19 = ~*puVar18;
      }
      lVar4 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      pRVar23 = runs + -1;
      do {
        pRVar22 = pRVar23;
        runs = runs + 1;
        uVar1 = pRVar22[1].end_pos;
        pRVar23 = pRVar22 + 1;
      } while ((uint)uVar1 < ((int)lVar3 + (int)lVar8 & 0xffffU));
      uVar16 = (short)lVar3 + (short)lVar8;
      uVar10 = (unsigned_short)(lVar4 + lVar17);
      uVar6 = (uint)(lVar4 + lVar17) & 0xffff;
      if (uVar6 < pRVar23->start_pos) {
        pRVar14->start_pos = uVar16;
        pRVar14->end_pos = uVar10;
        uVar5 = TTA::MemNewLabel();
      }
      else {
        uVar5 = pRVar22[1].label;
        TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar5] =
             TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar5] + 1;
        uVar5 = TTA::mem_rtable_.vec_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar5];
        if (uVar1 < uVar6) {
          do {
            pRVar23 = runs;
            if (uVar6 < pRVar23->start_pos) break;
            uVar2 = pRVar23->label;
            TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar2] =
                 TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar2] + 1;
            if (uVar5 != TTA::mem_rtable_.vec_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar2]) {
              uVar5 = TTA::MemMerge(uVar5,TTA::mem_rtable_.vec_.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar2]);
            }
            runs = pRVar23 + 1;
          } while (pRVar23->end_pos < uVar6);
          pRVar14->start_pos = uVar16;
        }
        else {
          pRVar14->start_pos = uVar16;
        }
        pRVar14->end_pos = uVar10;
      }
      pRVar14->label = uVar5;
      pRVar14 = pRVar14 + 1;
      lVar8 = lVar17;
      runs = pRVar23;
      uVar20 = -1L << ((byte)lVar4 & 0x3f) & ~uVar19;
    }
    if (puVar12 == puVar11) break;
    uVar20 = *puVar12;
    lVar8 = lVar8 + 0x40;
    puVar13 = puVar12;
  } while( true );
  pRVar14->start_pos = 0xffff;
  pRVar14->end_pos = 0xffff;
  lVar9 = lVar9 + 1;
  runs = pRVar15;
  goto LAB_001f3298;
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::MemGetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::MemMerge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }